

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O3

ostream * tcu::Format::operator<<(ostream *str,Array<const_char_*const_*> *fmt)

{
  char *__s;
  size_t sVar1;
  char **ppcVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(str,"{ ",2);
  ppcVar2 = fmt->begin;
  if (ppcVar2 != fmt->end) {
    do {
      if (ppcVar2 != fmt->begin) {
        std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
      }
      __s = *ppcVar2;
      if (__s == (char *)0x0) {
        std::ios::clear((int)str + (int)*(undefined8 *)(*(long *)str + -0x18));
      }
      else {
        sVar1 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(str,__s,sVar1);
      }
      ppcVar2 = ppcVar2 + 1;
    } while (ppcVar2 != fmt->end);
  }
  std::__ostream_insert<char,std::char_traits<char>>(str," }",2);
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Array<Iterator>& fmt)
{
	str << "{ ";
	for (Iterator cur = fmt.begin; cur != fmt.end; ++cur)
	{
		if (cur != fmt.begin)
			str << ", ";
		str << *cur;
	}
	str << " }";
	return str;
}